

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

char * stripbrackets(char *string)

{
  size_t sVar1;
  size_t length;
  char *buffer;
  char *ptr;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(string);
    string_local = string;
    if ((*string == '[') && (length = (size_t)string, ptr = string, string[sVar1 - 1] == ']')) {
      while (ptr[1] != ']') {
        *(char *)length = ptr[1];
        length = length + 1;
        ptr = ptr + 1;
      }
      *(undefined1 *)length = 0;
    }
  }
  return string_local;
}

Assistant:

char *stripbrackets(char *string) {
  if (!string)
    return NULL;
  char *ptr = string, *buffer = string;
  size_t length = strlen(string) - 1;
  if (*string == '[' && string[length] == ']') {
    while (*(++string) != ']') { *buffer++ = *string; }
    *buffer = 0;
  }
  return ptr;
}